

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorpickermenu.cpp
# Opt level: O1

DMenu * StartPickerMenu(DMenu *parent,char *name,FColorCVar *cvar)

{
  long *plVar1;
  long *plVar2;
  DColorPickerMenu *this;
  
  plVar1 = (long *)((long)&(MenuDescriptors.Nodes)->Next +
                   (ulong)((MenuDescriptors.Size - 1 & 0x20f) * 0x18));
  while ((plVar2 = plVar1, plVar2 != (long *)0x0 && ((long *)*plVar2 != (long *)0x1))) {
    plVar1 = (long *)*plVar2;
    if ((int)plVar2[1] == 0x20f) {
LAB_00304b49:
      if ((plVar2 == (long *)0x0) || (*(int *)(plVar2[2] + 0x18) != 1)) {
        this = (DColorPickerMenu *)0x0;
      }
      else {
        this = (DColorPickerMenu *)
               M_Malloc_Dbg(0x68,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                            ,0x1f9);
        DColorPickerMenu::DColorPickerMenu(this,parent,name,(FOptionMenuDescriptor *)plVar2[2],cvar)
        ;
      }
      return (DMenu *)this;
    }
  }
  plVar2 = (long *)0x0;
  goto LAB_00304b49;
}

Assistant:

DMenu *StartPickerMenu(DMenu *parent, const char *name, FColorCVar *cvar)
{
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_Colorpickermenu);
	if (desc != NULL && (*desc)->mType == MDESC_OptionsMenu)
	{
		return new DColorPickerMenu(parent, name, (FOptionMenuDescriptor*)(*desc), cvar);
	}
	else
	{
		return NULL;
	}
}